

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O1

Vector4f operator*(Matrix4f *m,Vector4f *v)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  Vector4f *in_RDX;
  float *pfVar4;
  int i;
  long lVar5;
  int j;
  long lVar6;
  undefined8 uVar7;
  Vector4f VVar8;
  
  uVar7 = 0;
  Vector4f::Vector4f((Vector4f *)m,0.0,0.0,0.0,0.0);
  lVar5 = 0;
  do {
    lVar6 = 0;
    pfVar4 = v->m_elements;
    do {
      fVar1 = *pfVar4;
      pfVar3 = Vector4f::operator[](in_RDX,(int)lVar6);
      fVar2 = *pfVar3;
      pfVar3 = Vector4f::operator[]((Vector4f *)m,(int)lVar5);
      VVar8.m_elements[0] = fVar1 * fVar2 + *pfVar3;
      VVar8.m_elements[1] = 0.0;
      *pfVar3 = VVar8.m_elements[0];
      lVar6 = lVar6 + 1;
      pfVar4 = pfVar4 + 4;
    } while (lVar6 != 4);
    lVar5 = lVar5 + 1;
    v = (Vector4f *)((long)v + 4);
  } while (lVar5 != 4);
  VVar8.m_elements[2] = (float)(int)uVar7;
  VVar8.m_elements[3] = (float)(int)((ulong)uVar7 >> 0x20);
  return (Vector4f)VVar8.m_elements;
}

Assistant:

Vector4f operator * ( const Matrix4f& m, const Vector4f& v )
{
	Vector4f output( 0, 0, 0, 0 );

	for( int i = 0; i < 4; ++i )
	{
		for( int j = 0; j < 4; ++j )
		{
			output[ i ] += m( i, j ) * v[ j ];
		}
	}

	return output;
}